

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O0

_Bool golf_bvh_ball_test(golf_bvh_t *bvh,vec3 bp,float br,vec3 bv,golf_ball_contact_t *contacts,
                        int *num_ball_contacts,int max_ball_contacts)

{
  _Bool _Var1;
  int max_ball_contacts_local;
  int *num_ball_contacts_local;
  golf_ball_contact_t *contacts_local;
  float br_local;
  golf_bvh_t *bvh_local;
  vec3 bv_local;
  vec3 bp_local;
  
  _Var1 = _golf_bvh_ball_test(bvh,bvh->parent,bp,br,bv,contacts,num_ball_contacts,max_ball_contacts)
  ;
  return _Var1;
}

Assistant:

static bool _golf_bvh_ball_test(golf_bvh_t *bvh, int node_idx, vec3 bp, float br, vec3 bv, golf_ball_contact_t *contacts, int *num_ball_contacts, int max_ball_contacts) {
    if (node_idx < 0) {
        return false;
    }

    golf_bvh_node_t *node = _get_node(bvh, node_idx);
    if (!sphere_intersect_aabb(bp, br, node->aabb.min, node->aabb.max)) {
        return false;
    }

    if (node->is_leaf) {
        golf_bvh_node_info_t info = node->leaf_node_info;

        bool any_hit = false;
        for (int i = 0; i < info.face_count; i++) {
            int face_idx = info.face_start + i;
            golf_bvh_face_t face = bvh->faces.data[face_idx];

            triangle_contact_type_t type;
            vec3 cp = closest_point_point_triangle(bp, face.a, face.b, face.c, &type);
            float dist = vec3_distance(bp, cp);
            if (dist < br) {
                if (*num_ball_contacts < max_ball_contacts) {
                    vec3 vel = golf_entity_get_velocity(face.level, face.entity, face.t, cp);
                    bool is_out_of_bounds = face.entity->parent_idx >= 0;
                    bool is_water = face.entity->type == WATER_ENTITY;
                    vec3 water_dir = face.water_dir;
                    golf_ball_contact_t contact = golf_ball_contact(face.a, face.b, face.c, vel, bp, br, cp, dist, face.restitution, face.friction, face.vel_scale, type, is_water, water_dir, is_out_of_bounds);
                    contacts[*num_ball_contacts] = contact;
                    *num_ball_contacts = *num_ball_contacts + 1;
                }

                any_hit = true;
            }
        }
        return any_hit;
    }
    else {
        bool left_test = _golf_bvh_ball_test(bvh, node->left, bp, br, bv, contacts, num_ball_contacts, max_ball_contacts);
        bool right_test = _golf_bvh_ball_test(bvh, node->right, bp, br, bv, contacts, num_ball_contacts, max_ball_contacts);
        return left_test || right_test;
    }

    return true;
}